

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O3

ssize_t __thiscall VCXProjectWriter::write(VCXProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  QArrayData *pQVar1;
  QArrayData *pQVar2;
  QArrayData *pQVar3;
  QArrayData *pQVar4;
  QArrayData *pQVar5;
  QArrayData *pQVar6;
  QArrayData *pQVar7;
  QArrayData *pQVar8;
  QArrayData *pQVar9;
  QArrayData *pQVar10;
  QArrayData *pQVar11;
  QArrayData *pQVar12;
  QArrayData *pQVar13;
  QArrayData *pQVar14;
  QArrayData *pQVar15;
  QArrayData *pQVar16;
  QArrayData *pQVar17;
  QArrayData *pQVar18;
  QArrayData *pQVar19;
  QArrayData *pQVar20;
  QArrayData *pQVar21;
  QArrayData *pQVar22;
  QArrayData *pQVar23;
  QArrayData *pQVar24;
  QArrayData *pQVar25;
  QArrayData *pQVar26;
  QArrayData *pQVar27;
  Data *pDVar28;
  char16_t *pcVar29;
  undefined8 uVar30;
  XmlOutput *pXVar31;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QByteArrayView QVar35;
  QByteArrayView QVar36;
  QByteArrayView QVar37;
  QByteArrayView QVar38;
  QByteArrayView QVar39;
  QByteArrayView QVar40;
  QByteArrayView QVar41;
  QByteArrayView QVar42;
  QByteArrayView QVar43;
  QByteArrayView QVar44;
  QByteArrayView QVar45;
  QByteArrayView QVar46;
  QByteArrayView QVar47;
  QByteArrayView QVar48;
  QByteArrayView QVar49;
  QByteArrayView QVar50;
  QByteArrayView QVar51;
  QByteArrayView QVar52;
  QByteArrayView QVar53;
  QByteArrayView QVar54;
  QByteArrayView QVar55;
  QByteArrayView QVar56;
  QByteArrayView QVar57;
  QByteArrayView QVar58;
  QByteArrayView QVar59;
  QByteArrayView QVar60;
  xml_output local_788;
  xml_output local_750;
  xml_output local_718;
  xml_output local_6e0;
  xml_output local_6a8;
  xml_output local_670;
  xml_output local_638;
  xml_output local_600;
  xml_output local_5c8;
  xml_output local_590;
  xml_output local_558;
  xml_output local_520;
  xml_output local_4e8;
  xml_output local_4b0;
  xml_output local_478;
  xml_output local_440;
  QString local_408;
  xml_output local_3f0;
  QStringBuilder<QString,_QString_&> local_3b8;
  QString local_398;
  xml_output local_380;
  xml_output local_348;
  xml_output local_310;
  xml_output local_2d8;
  xml_output local_2a0;
  xml_output local_268;
  xml_output local_230;
  xml_output local_1f8;
  xml_output local_1c0;
  xml_output local_188;
  xml_output local_150;
  QString local_118;
  xml_output local_100;
  xml_output local_c8;
  xml_output local_90;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_90.xo_text.d.size = *(long *)((long)__buf + 0x40) + 0x60;
  local_90._0_8_ = (QArrayData *)0x0;
  local_90.xo_text.d.d = (Data *)0x2b1914;
  local_90.xo_text.d.ptr = (char16_t *)&DAT_0000000c;
  QStringBuilder<QString,_QString_&>::convertTo<QString>
            (&local_58,(QStringBuilder<QString,_QString_&> *)&local_90);
  if ((QArrayData *)local_90._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_90._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_90._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_90._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_90._0_8_,2,0x10);
    }
  }
  QVar32.m_data = (storage_type *)0x6;
  QVar32.m_size = (qsizetype)&local_90;
  QString::fromUtf8(QVar32);
  local_90.xo_text.d.size = (qsizetype)local_90.xo_text.d.ptr;
  local_90.xo_text.d.ptr = (char16_t *)local_90.xo_text.d.d;
  uVar30 = local_90._0_8_;
  local_90.xo_type = tTag;
  local_90.xo_text.d.d = (Data *)uVar30;
  if ((QArrayData *)uVar30 != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)uVar30)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)uVar30)->_q_value).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_90.xo_value.d.d = (Data *)0x0;
  local_90.xo_value.d.ptr = (char16_t *)0x0;
  local_90.xo_value.d.size = 0;
  pXVar31 = XmlOutput::operator<<((XmlOutput *)CONCAT44(in_register_00000034,__fd),&local_90);
  QVar33.m_data = (storage_type *)0x4;
  QVar33.m_size = (qsizetype)&local_c8;
  QString::fromUtf8(QVar33);
  local_c8.xo_text.d.size = (qsizetype)local_c8.xo_text.d.ptr;
  pQVar27 = (QArrayData *)CONCAT44(local_c8._4_4_,local_c8.xo_type);
  local_c8.xo_type = tAttributeTag;
  local_c8.xo_text.d.ptr = (char16_t *)local_c8.xo_text.d.d;
  if (pQVar27 != (QArrayData *)0x0) {
    LOCK();
    (pQVar27->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar27->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_c8.xo_value.d.d = local_58.d.d;
  local_c8.xo_value.d.ptr = local_58.d.ptr;
  local_c8.xo_value.d.size = local_58.d.size;
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_c8.xo_text.d.d = (Data *)pQVar27;
  pXVar31 = XmlOutput::operator<<(pXVar31,&local_c8);
  QVar34.m_data = (storage_type *)0x9;
  QVar34.m_size = (qsizetype)&local_100;
  QString::fromUtf8(QVar34);
  pcVar29 = local_100.xo_text.d.ptr;
  pQVar26 = (QArrayData *)CONCAT44(local_100._4_4_,local_100.xo_type);
  generateCondition(&local_118,*(VCConfiguration **)((long)__buf + 0x40));
  local_100.xo_type = tAttributeTag;
  local_100.xo_text.d.ptr = (char16_t *)local_100.xo_text.d.d;
  local_100.xo_text.d.size = (qsizetype)pcVar29;
  if (pQVar26 != (QArrayData *)0x0) {
    LOCK();
    (pQVar26->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar26->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_100.xo_value.d.d = local_118.d.d;
  local_100.xo_value.d.ptr = local_118.d.ptr;
  local_100.xo_value.d.size = local_118.d.size;
  if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_100.xo_text.d.d = (Data *)pQVar26;
  pXVar31 = XmlOutput::operator<<(pXVar31,&local_100);
  QVar35.m_data = (storage_type *)0x6;
  QVar35.m_size = (qsizetype)&local_150;
  QString::fromUtf8(QVar35);
  pcVar29 = local_150.xo_text.d.ptr;
  pDVar28 = local_150.xo_text.d.d;
  pQVar24 = (QArrayData *)CONCAT44(local_150._4_4_,local_150.xo_type);
  QVar36.m_data = (storage_type *)0x1b;
  QVar36.m_size = (qsizetype)&local_150;
  QString::fromUtf8(QVar36);
  local_150.xo_value.d.size = (qsizetype)local_150.xo_text.d.ptr;
  pQVar25 = (QArrayData *)CONCAT44(local_150._4_4_,local_150.xo_type);
  local_150.xo_type = tAttributeTag;
  local_150.xo_text.d.ptr = (char16_t *)pDVar28;
  local_150.xo_text.d.size = (qsizetype)pcVar29;
  if (pQVar24 != (QArrayData *)0x0) {
    LOCK();
    (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_150.xo_value.d.ptr = (char16_t *)local_150.xo_text.d.d;
  if (pQVar25 != (QArrayData *)0x0) {
    LOCK();
    (pQVar25->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar25->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_150.xo_text.d.d = (Data *)pQVar24;
  local_150.xo_value.d.d = (Data *)pQVar25;
  pXVar31 = XmlOutput::operator<<(pXVar31,&local_150);
  QVar37.m_data = (storage_type *)0x7;
  QVar37.m_size = (qsizetype)&local_188;
  QString::fromUtf8(QVar37);
  local_188.xo_text.d.size = (qsizetype)local_188.xo_text.d.ptr;
  pQVar23 = (QArrayData *)CONCAT44(local_188._4_4_,local_188.xo_type);
  local_188.xo_type = tAttributeTag;
  local_188.xo_text.d.ptr = (char16_t *)local_188.xo_text.d.d;
  if (pQVar23 != (QArrayData *)0x0) {
    LOCK();
    (pQVar23->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar23->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_188.xo_value.d.d = *(Data **)((long)__buf + 8);
  local_188.xo_value.d.ptr = *(char16_t **)((long)__buf + 0x10);
  local_188.xo_value.d.size = *(qsizetype *)((long)__buf + 0x18);
  if (&(local_188.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_188.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_188.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         1;
    UNLOCK();
  }
  local_188.xo_text.d.d = (Data *)pQVar23;
  pXVar31 = XmlOutput::operator<<(pXVar31,&local_188);
  QVar38.m_data = (storage_type *)0x7;
  QVar38.m_size = (qsizetype)&local_1c0;
  QString::fromUtf8(QVar38);
  local_1c0.xo_text.d.size = (qsizetype)local_1c0.xo_text.d.ptr;
  pQVar22 = (QArrayData *)CONCAT44(local_1c0._4_4_,local_1c0.xo_type);
  local_1c0.xo_type = tTag;
  local_1c0.xo_text.d.ptr = (char16_t *)local_1c0.xo_text.d.d;
  if (pQVar22 != (QArrayData *)0x0) {
    LOCK();
    (pQVar22->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar22->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_1c0.xo_value.d.d = (Data *)0x0;
  local_1c0.xo_value.d.ptr = (char16_t *)0x0;
  local_1c0.xo_value.d.size = 0;
  local_1c0.xo_text.d.d = (Data *)pQVar22;
  pXVar31 = XmlOutput::operator<<(pXVar31,&local_1c0);
  QVar39.m_data = (storage_type *)0x4;
  QVar39.m_size = (qsizetype)&local_1f8;
  QString::fromUtf8(QVar39);
  local_1f8.xo_text.d.size = (qsizetype)local_1f8.xo_text.d.ptr;
  pQVar21 = (QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8.xo_type);
  local_1f8.xo_type = tAttributeTag;
  local_1f8.xo_text.d.ptr = (char16_t *)local_1f8.xo_text.d.d;
  if (pQVar21 != (QArrayData *)0x0) {
    LOCK();
    (pQVar21->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar21->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_1f8.xo_value.d.d = *(Data **)((long)__buf + 0x20);
  local_1f8.xo_value.d.ptr = *(char16_t **)((long)__buf + 0x28);
  local_1f8.xo_value.d.size = *(qsizetype *)((long)__buf + 0x30);
  if (&(local_1f8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1f8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1f8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         1;
    UNLOCK();
  }
  local_1f8.xo_text.d.d = (Data *)pQVar21;
  pXVar31 = XmlOutput::operator<<(pXVar31,&local_1f8);
  local_230.xo_type = tCloseTag;
  local_230.xo_text.d.d = (Data *)0x0;
  local_230.xo_text.d.ptr = (char16_t *)0x0;
  local_230.xo_text.d.size = 0;
  local_230.xo_value.d.d = (Data *)0x0;
  local_230.xo_value.d.ptr = (char16_t *)0x0;
  local_230.xo_value.d.size = 0;
  pXVar31 = XmlOutput::operator<<(pXVar31,&local_230);
  QVar40.m_data = (storage_type *)0x4;
  QVar40.m_size = (qsizetype)&local_268;
  QString::fromUtf8(QVar40);
  local_268.xo_text.d.size = (qsizetype)local_268.xo_text.d.ptr;
  pQVar20 = (QArrayData *)CONCAT44(local_268._4_4_,local_268.xo_type);
  local_268.xo_type = tTag;
  local_268.xo_text.d.ptr = (char16_t *)local_268.xo_text.d.d;
  if (pQVar20 != (QArrayData *)0x0) {
    LOCK();
    (pQVar20->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar20->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_268.xo_value.d.d = (Data *)0x0;
  local_268.xo_value.d.ptr = (char16_t *)0x0;
  local_268.xo_value.d.size = 0;
  local_268.xo_text.d.d = (Data *)pQVar20;
  pXVar31 = XmlOutput::operator<<(pXVar31,&local_268);
  QVar41.m_data = (storage_type *)0x7;
  QVar41.m_size = (qsizetype)&local_2a0;
  QString::fromUtf8(QVar41);
  local_2a0.xo_text.d.size = (qsizetype)local_2a0.xo_text.d.ptr;
  pQVar19 = (QArrayData *)CONCAT44(local_2a0._4_4_,local_2a0.xo_type);
  local_2a0.xo_type = tAttributeTag;
  local_2a0.xo_text.d.ptr = (char16_t *)local_2a0.xo_text.d.d;
  if (pQVar19 != (QArrayData *)0x0) {
    LOCK();
    (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_2a0.xo_value.d.d = *(Data **)((long)__buf + 0x20);
  local_2a0.xo_value.d.ptr = *(char16_t **)((long)__buf + 0x28);
  local_2a0.xo_value.d.size = *(qsizetype *)((long)__buf + 0x30);
  if (&(local_2a0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         1;
    UNLOCK();
  }
  local_2a0.xo_text.d.d = (Data *)pQVar19;
  pXVar31 = XmlOutput::operator<<(pXVar31,&local_2a0);
  local_2d8.xo_type = tCloseTag;
  local_2d8.xo_text.d.d = (Data *)0x0;
  local_2d8.xo_text.d.ptr = (char16_t *)0x0;
  local_2d8.xo_text.d.size = 0;
  local_2d8.xo_value.d.d = (Data *)0x0;
  local_2d8.xo_value.d.ptr = (char16_t *)0x0;
  local_2d8.xo_value.d.size = 0;
  pXVar31 = XmlOutput::operator<<(pXVar31,&local_2d8);
  local_310.xo_type = tCloseTag;
  local_310.xo_text.d.d = (Data *)0x0;
  local_310.xo_text.d.ptr = (char16_t *)0x0;
  local_310.xo_text.d.size = 0;
  local_310.xo_value.d.d = (Data *)0x0;
  local_310.xo_value.d.ptr = (char16_t *)0x0;
  local_310.xo_value.d.size = 0;
  pXVar31 = XmlOutput::operator<<(pXVar31,&local_310);
  QVar42.m_data = (storage_type *)0x6;
  QVar42.m_size = (qsizetype)&local_348;
  QString::fromUtf8(QVar42);
  local_348.xo_text.d.size = (qsizetype)local_348.xo_text.d.ptr;
  pQVar18 = (QArrayData *)CONCAT44(local_348._4_4_,local_348.xo_type);
  local_348.xo_type = tTag;
  local_348.xo_text.d.ptr = (char16_t *)local_348.xo_text.d.d;
  if (pQVar18 != (QArrayData *)0x0) {
    LOCK();
    (pQVar18->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar18->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_348.xo_value.d.d = (Data *)0x0;
  local_348.xo_value.d.ptr = (char16_t *)0x0;
  local_348.xo_value.d.size = 0;
  local_348.xo_text.d.d = (Data *)pQVar18;
  pXVar31 = XmlOutput::operator<<(pXVar31,&local_348);
  QVar43.m_data = (storage_type *)0x4;
  QVar43.m_size = (qsizetype)&local_380;
  QString::fromUtf8(QVar43);
  pcVar29 = local_380.xo_text.d.ptr;
  pQVar17 = (QArrayData *)CONCAT44(local_380._4_4_,local_380.xo_type);
  local_3b8.b = (QString *)(*(long *)((long)__buf + 0x40) + 0x60);
  local_3b8.a.d.d = (Data *)0x0;
  local_3b8.a.d.ptr = L"PopulateWinDeployQtItems_";
  local_3b8.a.d.size = 0x19;
  QStringBuilder<QString,_QString_&>::convertTo<QString>(&local_398,&local_3b8);
  local_380.xo_type = tAttributeTag;
  local_380.xo_text.d.ptr = (char16_t *)local_380.xo_text.d.d;
  local_380.xo_text.d.size = (qsizetype)pcVar29;
  if (pQVar17 != (QArrayData *)0x0) {
    LOCK();
    (pQVar17->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar17->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_380.xo_value.d.d = local_398.d.d;
  local_380.xo_value.d.ptr = local_398.d.ptr;
  local_380.xo_value.d.size = local_398.d.size;
  if (&(local_398.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_398.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_398.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_380.xo_text.d.d = (Data *)pQVar17;
  pXVar31 = XmlOutput::operator<<(pXVar31,&local_380);
  QVar44.m_data = (storage_type *)0x9;
  QVar44.m_size = (qsizetype)&local_3f0;
  QString::fromUtf8(QVar44);
  pcVar29 = local_3f0.xo_text.d.ptr;
  pQVar16 = (QArrayData *)CONCAT44(local_3f0._4_4_,local_3f0.xo_type);
  generateCondition(&local_408,*(VCConfiguration **)((long)__buf + 0x40));
  local_3f0.xo_type = tAttributeTag;
  local_3f0.xo_text.d.ptr = (char16_t *)local_3f0.xo_text.d.d;
  local_3f0.xo_text.d.size = (qsizetype)pcVar29;
  if (pQVar16 != (QArrayData *)0x0) {
    LOCK();
    (pQVar16->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar16->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_3f0.xo_value.d.d = local_408.d.d;
  local_3f0.xo_value.d.ptr = local_408.d.ptr;
  local_3f0.xo_value.d.size = local_408.d.size;
  if (&(local_408.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_408.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_408.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_3f0.xo_text.d.d = (Data *)pQVar16;
  pXVar31 = XmlOutput::operator<<(pXVar31,&local_3f0);
  QVar45.m_data = &DAT_0000000c;
  QVar45.m_size = (qsizetype)&local_440;
  QString::fromUtf8(QVar45);
  pcVar29 = local_440.xo_text.d.ptr;
  pDVar28 = local_440.xo_text.d.d;
  pQVar14 = (QArrayData *)CONCAT44(local_440._4_4_,local_440.xo_type);
  QVar46.m_data = (storage_type *)0x4;
  QVar46.m_size = (qsizetype)&local_440;
  QString::fromUtf8(QVar46);
  local_440.xo_value.d.size = (qsizetype)local_440.xo_text.d.ptr;
  pQVar15 = (QArrayData *)CONCAT44(local_440._4_4_,local_440.xo_type);
  local_440.xo_type = tAttributeTag;
  local_440.xo_text.d.ptr = (char16_t *)pDVar28;
  local_440.xo_text.d.size = (qsizetype)pcVar29;
  if (pQVar14 != (QArrayData *)0x0) {
    LOCK();
    (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_440.xo_value.d.ptr = (char16_t *)local_440.xo_text.d.d;
  if (pQVar15 != (QArrayData *)0x0) {
    LOCK();
    (pQVar15->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar15->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_440.xo_text.d.d = (Data *)pQVar14;
  local_440.xo_value.d.d = (Data *)pQVar15;
  pXVar31 = XmlOutput::operator<<(pXVar31,&local_440);
  QVar47.m_data = (storage_type *)0x10;
  QVar47.m_size = (qsizetype)&local_478;
  QString::fromUtf8(QVar47);
  local_478.xo_text.d.size = (qsizetype)local_478.xo_text.d.ptr;
  pQVar13 = (QArrayData *)CONCAT44(local_478._4_4_,local_478.xo_type);
  local_478.xo_type = tAttributeTag;
  local_478.xo_text.d.ptr = (char16_t *)local_478.xo_text.d.d;
  if (pQVar13 != (QArrayData *)0x0) {
    LOCK();
    (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_478.xo_value.d.d = local_58.d.d;
  local_478.xo_value.d.ptr = local_58.d.ptr;
  local_478.xo_value.d.size = local_58.d.size;
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_478.xo_text.d.d = (Data *)pQVar13;
  pXVar31 = XmlOutput::operator<<(pXVar31,&local_478);
  QVar48.m_data = (storage_type *)0x11;
  QVar48.m_size = (qsizetype)&local_4b0;
  QString::fromUtf8(QVar48);
  local_4b0.xo_text.d.size = (qsizetype)local_4b0.xo_text.d.ptr;
  pQVar12 = (QArrayData *)CONCAT44(local_4b0._4_4_,local_4b0.xo_type);
  local_4b0.xo_type = tTag;
  local_4b0.xo_text.d.ptr = (char16_t *)local_4b0.xo_text.d.d;
  if (pQVar12 != (QArrayData *)0x0) {
    LOCK();
    (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_4b0.xo_value.d.d = (Data *)0x0;
  local_4b0.xo_value.d.ptr = (char16_t *)0x0;
  local_4b0.xo_value.d.size = 0;
  local_4b0.xo_text.d.d = (Data *)pQVar12;
  pXVar31 = XmlOutput::operator<<(pXVar31,&local_4b0);
  QVar49.m_data = (storage_type *)0x4;
  QVar49.m_size = (qsizetype)&local_4e8;
  QString::fromUtf8(QVar49);
  local_4e8.xo_text.d.size = (qsizetype)local_4e8.xo_text.d.ptr;
  pQVar11 = (QArrayData *)CONCAT44(local_4e8._4_4_,local_4e8.xo_type);
  local_4e8.xo_type = tAttributeTag;
  local_4e8.xo_text.d.ptr = (char16_t *)local_4e8.xo_text.d.d;
  if (pQVar11 != (QArrayData *)0x0) {
    LOCK();
    (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_4e8.xo_value.d.d = *(Data **)((long)__buf + 8);
  local_4e8.xo_value.d.ptr = *(char16_t **)((long)__buf + 0x10);
  local_4e8.xo_value.d.size = *(qsizetype *)((long)__buf + 0x18);
  if (&(local_4e8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_4e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_4e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         1;
    UNLOCK();
  }
  local_4e8.xo_text.d.d = (Data *)pQVar11;
  pXVar31 = XmlOutput::operator<<(pXVar31,&local_4e8);
  QVar50.m_data = (storage_type *)0x6;
  QVar50.m_size = (qsizetype)&local_520;
  QString::fromUtf8(QVar50);
  local_520.xo_text.d.size = (qsizetype)local_520.xo_text.d.ptr;
  pQVar10 = (QArrayData *)CONCAT44(local_520._4_4_,local_520.xo_type);
  local_520.xo_type = tTag;
  local_520.xo_text.d.ptr = (char16_t *)local_520.xo_text.d.d;
  if (pQVar10 != (QArrayData *)0x0) {
    LOCK();
    (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_520.xo_value.d.d = (Data *)0x0;
  local_520.xo_value.d.ptr = (char16_t *)0x0;
  local_520.xo_value.d.size = 0;
  local_520.xo_text.d.d = (Data *)pQVar10;
  pXVar31 = XmlOutput::operator<<(pXVar31,&local_520);
  QVar51.m_data = (storage_type *)0xd;
  QVar51.m_size = (qsizetype)&local_558;
  QString::fromUtf8(QVar51);
  pcVar29 = local_558.xo_text.d.ptr;
  pDVar28 = local_558.xo_text.d.d;
  pQVar8 = (QArrayData *)CONCAT44(local_558._4_4_,local_558.xo_type);
  QVar52.m_data = (storage_type *)0x5;
  QVar52.m_size = (qsizetype)&local_558;
  QString::fromUtf8(QVar52);
  local_558.xo_value.d.size = (qsizetype)local_558.xo_text.d.ptr;
  pQVar9 = (QArrayData *)CONCAT44(local_558._4_4_,local_558.xo_type);
  local_558.xo_type = tAttributeTag;
  local_558.xo_text.d.ptr = (char16_t *)pDVar28;
  local_558.xo_text.d.size = (qsizetype)pcVar29;
  if (pQVar8 != (QArrayData *)0x0) {
    LOCK();
    (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_558.xo_value.d.ptr = (char16_t *)local_558.xo_text.d.d;
  if (pQVar9 != (QArrayData *)0x0) {
    LOCK();
    (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_558.xo_text.d.d = (Data *)pQVar8;
  local_558.xo_value.d.d = (Data *)pQVar9;
  pXVar31 = XmlOutput::operator<<(pXVar31,&local_558);
  QVar53.m_data = &DAT_00000008;
  QVar53.m_size = (qsizetype)&local_590;
  QString::fromUtf8(QVar53);
  pcVar29 = local_590.xo_text.d.ptr;
  pDVar28 = local_590.xo_text.d.d;
  pQVar6 = (QArrayData *)CONCAT44(local_590._4_4_,local_590.xo_type);
  QVar54.m_data = (storage_type *)0xf;
  QVar54.m_size = (qsizetype)&local_590;
  QString::fromUtf8(QVar54);
  local_590.xo_value.d.size = (qsizetype)local_590.xo_text.d.ptr;
  pQVar7 = (QArrayData *)CONCAT44(local_590._4_4_,local_590.xo_type);
  local_590.xo_type = tAttributeTag;
  local_590.xo_text.d.ptr = (char16_t *)pDVar28;
  local_590.xo_text.d.size = (qsizetype)pcVar29;
  if (pQVar6 != (QArrayData *)0x0) {
    LOCK();
    (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_590.xo_value.d.ptr = (char16_t *)local_590.xo_text.d.d;
  if (pQVar7 != (QArrayData *)0x0) {
    LOCK();
    (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_590.xo_text.d.d = (Data *)pQVar6;
  local_590.xo_value.d.d = (Data *)pQVar7;
  pXVar31 = XmlOutput::operator<<(pXVar31,&local_590);
  local_5c8.xo_type = tCloseTag;
  local_5c8.xo_text.d.d = (Data *)0x0;
  local_5c8.xo_text.d.ptr = (char16_t *)0x0;
  local_5c8.xo_text.d.size = 0;
  local_5c8.xo_value.d.d = (Data *)0x0;
  local_5c8.xo_value.d.ptr = (char16_t *)0x0;
  local_5c8.xo_value.d.size = 0;
  pXVar31 = XmlOutput::operator<<(pXVar31,&local_5c8);
  local_600.xo_type = tCloseTag;
  local_600.xo_text.d.d = (Data *)0x0;
  local_600.xo_text.d.ptr = (char16_t *)0x0;
  local_600.xo_text.d.size = 0;
  local_600.xo_value.d.d = (Data *)0x0;
  local_600.xo_value.d.ptr = (char16_t *)0x0;
  local_600.xo_value.d.size = 0;
  pXVar31 = XmlOutput::operator<<(pXVar31,&local_600);
  QVar55.m_data = (storage_type *)0x9;
  QVar55.m_size = (qsizetype)&local_638;
  QString::fromUtf8(QVar55);
  local_638.xo_text.d.size = (qsizetype)local_638.xo_text.d.ptr;
  pQVar5 = (QArrayData *)CONCAT44(local_638._4_4_,local_638.xo_type);
  local_638.xo_type = tTag;
  local_638.xo_text.d.ptr = (char16_t *)local_638.xo_text.d.d;
  if (pQVar5 != (QArrayData *)0x0) {
    LOCK();
    (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_638.xo_value.d.d = (Data *)0x0;
  local_638.xo_value.d.ptr = (char16_t *)0x0;
  local_638.xo_value.d.size = 0;
  local_638.xo_text.d.d = (Data *)pQVar5;
  pXVar31 = XmlOutput::operator<<(pXVar31,&local_638);
  QVar56.m_data = (storage_type *)0x4;
  QVar56.m_size = (qsizetype)&local_670;
  QString::fromUtf8(QVar56);
  local_670.xo_text.d.size = (qsizetype)local_670.xo_text.d.ptr;
  pQVar4 = (QArrayData *)CONCAT44(local_670._4_4_,local_670.xo_type);
  local_670.xo_type = tTag;
  local_670.xo_text.d.ptr = (char16_t *)local_670.xo_text.d.d;
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_670.xo_value.d.d = (Data *)0x0;
  local_670.xo_value.d.ptr = (char16_t *)0x0;
  local_670.xo_value.d.size = 0;
  local_670.xo_text.d.d = (Data *)pQVar4;
  pXVar31 = XmlOutput::operator<<(pXVar31,&local_670);
  QVar57.m_data = (storage_type *)0x7;
  QVar57.m_size = (qsizetype)&local_6a8;
  QString::fromUtf8(QVar57);
  pcVar29 = local_6a8.xo_text.d.ptr;
  pDVar28 = local_6a8.xo_text.d.d;
  pQVar2 = (QArrayData *)CONCAT44(local_6a8._4_4_,local_6a8.xo_type);
  QVar58.m_data = (storage_type *)0x12;
  QVar58.m_size = (qsizetype)&local_6a8;
  QString::fromUtf8(QVar58);
  local_6a8.xo_value.d.size = (qsizetype)local_6a8.xo_text.d.ptr;
  pQVar3 = (QArrayData *)CONCAT44(local_6a8._4_4_,local_6a8.xo_type);
  local_6a8.xo_type = tAttributeTag;
  local_6a8.xo_text.d.ptr = (char16_t *)pDVar28;
  local_6a8.xo_text.d.size = (qsizetype)pcVar29;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_6a8.xo_value.d.ptr = (char16_t *)local_6a8.xo_text.d.d;
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_6a8.xo_text.d.d = (Data *)pQVar2;
  local_6a8.xo_value.d.d = (Data *)pQVar3;
  pXVar31 = XmlOutput::operator<<(pXVar31,&local_6a8);
  QVar59.m_data = (storage_type *)0x11;
  QVar59.m_size = (qsizetype)&local_6e0;
  QString::fromUtf8(QVar59);
  pcVar29 = local_6e0.xo_text.d.ptr;
  pDVar28 = local_6e0.xo_text.d.d;
  pQVar1 = (QArrayData *)CONCAT44(local_6e0._4_4_,local_6e0.xo_type);
  QVar60.m_data = (storage_type *)0x4;
  QVar60.m_size = (qsizetype)&local_6e0;
  QString::fromUtf8(QVar60);
  local_6e0.xo_value.d.size = (qsizetype)local_6e0.xo_text.d.ptr;
  local_6e0.xo_value.d.d = (Data *)CONCAT44(local_6e0._4_4_,local_6e0.xo_type);
  local_6e0.xo_type = tTagValue;
  local_6e0.xo_text.d.ptr = (char16_t *)pDVar28;
  local_6e0.xo_text.d.size = (qsizetype)pcVar29;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_6e0.xo_value.d.ptr = (char16_t *)local_6e0.xo_text.d.d;
  local_6e0.xo_text.d.d = (Data *)pQVar1;
  if ((QArrayData *)local_6e0.xo_value.d.d != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)local_6e0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)local_6e0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    (((QArrayData *)local_6e0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)local_6e0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QArrayData *)local_6e0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate((QArrayData *)local_6e0.xo_value.d.d,2,0x10);
    }
  }
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,0x10);
    }
  }
  pXVar31 = XmlOutput::operator<<(pXVar31,&local_6e0);
  local_718.xo_type = tCloseTag;
  local_718.xo_text.d.d = (Data *)0x0;
  local_718.xo_text.d.ptr = (char16_t *)0x0;
  local_718.xo_text.d.size = 0;
  local_718.xo_value.d.d = (Data *)0x0;
  local_718.xo_value.d.ptr = (char16_t *)0x0;
  local_718.xo_value.d.size = 0;
  pXVar31 = XmlOutput::operator<<(pXVar31,&local_718);
  local_750.xo_type = tCloseTag;
  local_750.xo_text.d.d = (Data *)0x0;
  local_750.xo_text.d.ptr = (char16_t *)0x0;
  local_750.xo_text.d.size = 0;
  local_750.xo_value.d.d = (Data *)0x0;
  local_750.xo_value.d.ptr = (char16_t *)0x0;
  local_750.xo_value.d.size = 0;
  pXVar31 = XmlOutput::operator<<(pXVar31,&local_750);
  local_788.xo_type = tCloseTag;
  local_788.xo_text.d.d = (Data *)0x0;
  local_788.xo_text.d.ptr = (char16_t *)0x0;
  local_788.xo_text.d.size = 0;
  local_788.xo_value.d.d = (Data *)0x0;
  local_788.xo_value.d.ptr = (char16_t *)0x0;
  local_788.xo_value.d.size = 0;
  XmlOutput::operator<<(pXVar31,&local_788);
  if (&(local_788.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_788.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_788.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_788.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_788.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_788.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_788.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_788.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_788.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_788.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_750.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_750.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_750.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_750.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_750.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_750.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_750.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_750.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_750.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_750.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_718.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_718.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_718.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_718.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_718.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_718.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_718.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_718.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_718.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_718.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_6e0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_6e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_6e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_6e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_6e0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_6e0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_6e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_6e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_6e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_6e0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_6a8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_6a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_6a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_6a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_6a8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_6a8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_6a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_6a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_6a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_6a8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,2,0x10);
    }
  }
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,0x10);
    }
  }
  if (&(local_670.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_670.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_670.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_670.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_670.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_670.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_670.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_670.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_670.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_670.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,2,0x10);
    }
  }
  if (&(local_638.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_638.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_638.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_638.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_638.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_638.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_638.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_638.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_638.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_638.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar5 != (QArrayData *)0x0) {
    LOCK();
    (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar5,2,0x10);
    }
  }
  if (&(local_600.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_600.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_600.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_600.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_600.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_600.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_600.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_600.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_600.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_600.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_5c8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_5c8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_5c8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_5c8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_5c8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_5c8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_5c8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_5c8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_5c8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_5c8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_590.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_590.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_590.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_590.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_590.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_590.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_590.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_590.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_590.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_590.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar7 != (QArrayData *)0x0) {
    LOCK();
    (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar7->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar7,2,0x10);
    }
  }
  if (pQVar6 != (QArrayData *)0x0) {
    LOCK();
    (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar6,2,0x10);
    }
  }
  if (&(local_558.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_558.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_558.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_558.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_558.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_558.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_558.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_558.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_558.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_558.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar9 != (QArrayData *)0x0) {
    LOCK();
    (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar9->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar9,2,0x10);
    }
  }
  if (pQVar8 != (QArrayData *)0x0) {
    LOCK();
    (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar8,2,0x10);
    }
  }
  if (&(local_520.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_520.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_520.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_520.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_520.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_520.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_520.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_520.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_520.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_520.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar10 != (QArrayData *)0x0) {
    LOCK();
    (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar10->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar10,2,0x10);
    }
  }
  if (&(local_4e8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_4e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_4e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_4e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_4e8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_4e8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_4e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_4e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_4e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_4e8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar11 != (QArrayData *)0x0) {
    LOCK();
    (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar11->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar11,2,0x10);
    }
  }
  if (&(local_4b0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_4b0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_4b0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_4b0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_4b0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_4b0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_4b0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_4b0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_4b0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_4b0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar12 != (QArrayData *)0x0) {
    LOCK();
    (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar12->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar12,2,0x10);
    }
  }
  if (&(local_478.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_478.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_478.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_478.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_478.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_478.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_478.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_478.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_478.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_478.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar13 != (QArrayData *)0x0) {
    LOCK();
    (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar13,2,0x10);
    }
  }
  if (&(local_440.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_440.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_440.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_440.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_440.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_440.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_440.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_440.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_440.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_440.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar15 != (QArrayData *)0x0) {
    LOCK();
    (pQVar15->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar15->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar15->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar15,2,0x10);
    }
  }
  if (pQVar14 != (QArrayData *)0x0) {
    LOCK();
    (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar14->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar14,2,0x10);
    }
  }
  if (&(local_3f0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_3f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_3f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_3f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_3f0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_3f0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_3f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_3f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_3f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_3f0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_408.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_408.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_408.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_408.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_408.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar16 != (QArrayData *)0x0) {
    LOCK();
    (pQVar16->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar16->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar16->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar16,2,0x10);
    }
  }
  if (&(local_380.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_380.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_380.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_380.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_380.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_380.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_380.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_380.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_380.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_380.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_398.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_398.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_398.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_398.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_398.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_3b8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_3b8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_3b8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_3b8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_3b8.a.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar17 != (QArrayData *)0x0) {
    LOCK();
    (pQVar17->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar17->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar17->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar17,2,0x10);
    }
  }
  if (&(local_348.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_348.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_348.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_348.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_348.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_348.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_348.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_348.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_348.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_348.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar18 != (QArrayData *)0x0) {
    LOCK();
    (pQVar18->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar18->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar18->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar18,2,0x10);
    }
  }
  if (&(local_310.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_310.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_310.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_310.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_310.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_310.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_310.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_310.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_310.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_310.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_2d8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_2d8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_2d8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2d8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2d8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2d8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_2d8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_2a0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_2a0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_2a0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_2a0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar19 != (QArrayData *)0x0) {
    LOCK();
    (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar19->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar19,2,0x10);
    }
  }
  if (&(local_268.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_268.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_268.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_268.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_268.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_268.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_268.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_268.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_268.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_268.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar20 != (QArrayData *)0x0) {
    LOCK();
    (pQVar20->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar20->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar20->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar20,2,0x10);
    }
  }
  if (&(local_230.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_230.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_230.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_230.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_230.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_230.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_230.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_230.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_230.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_230.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_1f8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1f8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1f8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1f8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_1f8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_1f8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1f8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1f8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1f8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_1f8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar21 != (QArrayData *)0x0) {
    LOCK();
    (pQVar21->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar21->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar21->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar21,2,0x10);
    }
  }
  if (&(local_1c0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1c0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1c0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1c0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_1c0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_1c0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1c0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1c0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1c0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_1c0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar22 != (QArrayData *)0x0) {
    LOCK();
    (pQVar22->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar22->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar22->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar22,2,0x10);
    }
  }
  if (&(local_188.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_188.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_188.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_188.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_188.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_188.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_188.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_188.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_188.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_188.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar23 != (QArrayData *)0x0) {
    LOCK();
    (pQVar23->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar23->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar23->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar23,2,0x10);
    }
  }
  if (&(local_150.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_150.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_150.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_150.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_150.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_150.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_150.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_150.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_150.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_150.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar25 != (QArrayData *)0x0) {
    LOCK();
    (pQVar25->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar25->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar25->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar25,2,0x10);
    }
  }
  if (pQVar24 != (QArrayData *)0x0) {
    LOCK();
    (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar24->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar24,2,0x10);
    }
  }
  if (&(local_100.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_100.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_100.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_100.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_100.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_100.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_100.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_100.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_100.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_100.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar26 != (QArrayData *)0x0) {
    LOCK();
    (pQVar26->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar26->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar26->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar26,2,0x10);
    }
  }
  if (&(local_c8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_c8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_c8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_c8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_c8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_c8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar27 != (QArrayData *)0x0) {
    LOCK();
    (pQVar27->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar27->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar27->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar27,2,0x10);
    }
  }
  if (&(local_90.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_90.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_90.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_90.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_90.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_90.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_90.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_90.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_90.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_90.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)uVar30 != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)uVar30)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)uVar30)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)uVar30)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)uVar30,2,0x10);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void VCXProjectWriter::write(XmlOutput &xml, const VCWinDeployQtTool &tool)
{
    const QString name = QStringLiteral("WinDeployQt_") + tool.config->Name;
    xml << tag("Target")
           << attrTag(_Name, name)
           << attrTag("Condition", generateCondition(*tool.config))
           << attrTag("Inputs", "$(OutDir)\\$(TargetName).exe")
           << attrTag("Outputs", tool.Record)
           << tag(_Message)
              << attrTag("Text", tool.CommandLine)
           << closetag()
           << tag("Exec")
             << attrTag("Command", tool.CommandLine)
           << closetag()
        << closetag()
        << tag("Target")
           << attrTag(_Name, QStringLiteral("PopulateWinDeployQtItems_") + tool.config->Name)
           << attrTag("Condition", generateCondition(*tool.config))
           << attrTag("AfterTargets", "Link")
           << attrTag("DependsOnTargets", name)
           << tag("ReadLinesFromFile")
              << attrTag("File", tool.Record)
              << tag("Output")
                 << attrTag("TaskParameter", "Lines")
                 << attrTag("ItemName", "DeploymentItems")
              << closetag()
           << closetag()
           << tag(_ItemGroup)
              << tag("None")
                 << attrTag("Include", "@(DeploymentItems)")
                 << attrTagT("DeploymentContent", _True)
              << closetag()
           << closetag()
        << closetag();
}